

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict
find_def(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
        node_t_conflict *aux_node)

{
  symbol_t el_00;
  symbol_t el_01;
  int iVar1;
  symbol_t el;
  undefined4 uStack_8c;
  undefined8 uStack_78;
  undefined8 uStack_70;
  VARR_node_t *pVStack_68;
  symbol_t local_60;
  
  el_00._4_4_ = uStack_8c;
  el_00.mode = mode;
  el_00.id = id;
  el_00.scope = scope;
  el_00.def_node = (node_t_conflict)uStack_78;
  el_00.aux_node = (node_t_conflict)uStack_70;
  el_00.defs = pVStack_68;
  iVar1 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_00,HTAB_FIND,&local_60);
  while( true ) {
    if (iVar1 != 0) {
      if (aux_node != (node_t_conflict *)0x0) {
        *aux_node = local_60.aux_node;
      }
      return local_60.def_node;
    }
    if (scope == (node_t_conflict)0x0) break;
    scope = *(node_t_conflict *)((long)scope->attr + 0x20);
    el_01._4_4_ = uStack_8c;
    el_01.mode = mode;
    el_01.id = id;
    el_01.scope = scope;
    el_01.def_node = (node_t_conflict)uStack_78;
    el_01.aux_node = (node_t_conflict)uStack_70;
    el_01.defs = pVStack_68;
    iVar1 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,el_01,HTAB_FIND,&local_60);
  }
  return (node_t_conflict)0x0;
}

Assistant:

static node_t find_def (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t *aux_node) {
  symbol_t sym;

  for (;;) {
    if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
      if (scope == NULL) return NULL;
      scope = ((struct node_scope *) scope->attr)->scope;
    } else {
      if (aux_node) *aux_node = sym.aux_node;
      return sym.def_node;
    }
  }
}